

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CNegativeInvalidSizeArrays<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeInvalidSizeArrays<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  int i;
  GLuint GVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  CColorArray coords;
  TWrongStructure2 indirectArrays2;
  TWrongStructure1 indirectArrays;
  CColorArray bufferTest;
  CColorArray bufferRef;
  DIResult result;
  allocator_type local_509;
  string local_508;
  float local_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4d8;
  value_type local_4b8;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498 [23];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [23];
  long local_1a8;
  DILogger local_1a0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_4a8._0_8_ = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,0x1b3c1e9);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_328,(string *)local_4a8,
                     &local_508,true);
  this->_program = GVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != local_498) {
    operator_delete((void *)local_4a8._0_8_,local_498[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_328._1_7_,local_328[0]) != local_318) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_328._1_7_,local_328[0]),local_318[0]._M_allocated_capacity + 1
                   );
  }
  if (this->_program == 0) {
    lVar5 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_508._M_dataplus._M_p = (pointer)0x0;
    local_508._M_string_length = 0;
    local_508.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_508);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_508._M_string_length - (long)local_508._M_dataplus._M_p,
               local_508._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    _local_4e0 = CONCAT44(1,(int)(local_508._M_string_length - (long)local_508._M_dataplus._M_p >> 4
                                 ));
    buffers = &this->_bufferIndirect;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,8,&local_4e0,0x88e4);
    local_328[0] = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_328 + 8));
    local_1a8 = 0;
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x502) {
      local_1a8 = -1;
      local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4a8 + 8));
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4a8,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)local_4a8);
    }
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,buffers);
    _local_4e8 = CONCAT44(1,(float)(ulong)((long)(local_508._M_string_length -
                                                 (long)local_508._M_dataplus._M_p) >> 4));
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,8,&local_4e8,0x88e4);
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)0x0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 != 0x502) {
      local_1a8 = -1;
      local_4a8._0_8_ = local_4a8._0_8_ & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4a8 + 8));
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4a8,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)local_4a8);
    }
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4a8,
               (long)(iVar3 * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4)),
               (value_type *)&local_4d8,(allocator_type *)&local_4b8);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
    iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar4 = *(int *)(CONCAT44(extraout_var_02,iVar4) + 4);
    lVar5 = 0;
    do {
      local_4b8.m_data[lVar5] = 1.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4d8,(long)(iVar3 * iVar4),&local_4b8,&local_509);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_03,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar3) + 4),0x1908,0x1406,
               local_4d8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 4);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar3);
    iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar5 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_4d8,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_4a8,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar3) + 4));
    DIResult::sub_result(&local_1a0,(DIResult *)local_328,lVar5);
    DILogger::~DILogger(&local_1a0);
    lVar5 = local_1a8;
    if (local_4d8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4d8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_4a8._0_8_,local_498[0]._M_allocated_capacity - local_4a8._0_8_);
    }
    DILogger::~DILogger((DILogger *)local_328);
    if (local_508._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_508._M_dataplus._M_p,
                      local_508.field_2._M_allocated_capacity - (long)local_508._M_dataplus._M_p);
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		TWrongStructure1 indirectArrays = { 0, 0 };
		indirectArrays.count			= static_cast<GLuint>(coords.size());
		indirectArrays.primCount		= 1;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(TWrongStructure1), &indirectArrays, GL_STATIC_DRAW);

		DIResult result;

		glDrawArraysIndirect(GL_TRIANGLES, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		glDeleteBuffers(1, &_bufferIndirect);

		TWrongStructure2 indirectArrays2 = { 0, 0 };
		indirectArrays2.count			 = static_cast<GLfloat>(coords.size());
		indirectArrays2.primCount		 = 1;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(TWrongStructure2), &indirectArrays2, GL_STATIC_DRAW);

		glDrawArraysIndirect(GL_TRIANGLES, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}